

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

function<bool_(unsigned_int)> *
spvDbgInfoExtOperandCanBeForwardDeclaredFunction
          (function<bool_(unsigned_int)> *__return_storage_ptr__,Op opcode,
          spv_ext_inst_type_t ext_type,uint32_t key)

{
  anon_class_1_0_00000001 local_27;
  anon_class_1_0_00000001 local_26;
  anon_class_1_0_00000001 local_25;
  anon_class_1_0_00000001 local_24;
  anon_class_1_0_00000001 local_23;
  anon_class_1_0_00000001 local_22;
  undefined1 local_21;
  anon_class_4_1_64e6d48c local_20;
  uint32_t local_1c;
  spv_ext_inst_type_t local_18;
  uint32_t key_local;
  spv_ext_inst_type_t ext_type_local;
  Op opcode_local;
  function<bool_(unsigned_int)> *out;
  
  local_1c = key;
  local_18 = ext_type;
  key_local = opcode;
  _ext_type_local = __return_storage_ptr__;
  if (ext_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    local_20.opcode = opcode;
    std::function<bool(unsigned_int)>::
    function<spvDbgInfoExtOperandCanBeForwardDeclaredFunction(spv::Op,spv_ext_inst_type_t,unsigned_int)::__0,void>
              ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_20);
  }
  else {
    local_21 = 0;
    std::function<bool_(unsigned_int)>::function(__return_storage_ptr__);
    if (local_18 == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
      if (local_1c == 10) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_23);
      }
      else if (local_1c == 0x14) {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_22);
      }
      else {
        std::function<bool(unsigned_int)>::operator=
                  ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_24);
      }
    }
    else if (local_1c == 10) {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_26);
    }
    else if (local_1c == 0x14) {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_25);
    }
    else {
      std::function<bool(unsigned_int)>::operator=
                ((function<bool(unsigned_int)> *)__return_storage_ptr__,&local_27);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(unsigned)> spvDbgInfoExtOperandCanBeForwardDeclaredFunction(
    spv::Op opcode, spv_ext_inst_type_t ext_type, uint32_t key) {
  // The Vulkan debug info extended instruction set is non-semantic so allows no
  // forward references except if used through OpExtInstWithForwardRefsKHR.
  if (ext_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    return [opcode](unsigned) {
      return opcode == spv::Op::OpExtInstWithForwardRefsKHR;
    };
  }

  // TODO(https://gitlab.khronos.org/spirv/SPIR-V/issues/532): Forward
  // references for debug info instructions are still in discussion. We must
  // update the following lines of code when we conclude the spec.
  std::function<bool(unsigned index)> out;
  if (ext_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
    switch (OpenCLDebugInfo100Instructions(key)) {
      case OpenCLDebugInfo100DebugFunction:
        out = [](unsigned index) { return index == 13; };
        break;
      case OpenCLDebugInfo100DebugTypeComposite:
        out = [](unsigned index) { return index >= 13; };
        break;
      default:
        out = [](unsigned) { return false; };
        break;
    }
  } else {
    switch (DebugInfoInstructions(key)) {
      case DebugInfoDebugFunction:
        out = [](unsigned index) { return index == 13; };
        break;
      case DebugInfoDebugTypeComposite:
        out = [](unsigned index) { return index >= 12; };
        break;
      default:
        out = [](unsigned) { return false; };
        break;
    }
  }
  return out;
}